

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_binder.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::OrderBinder::CreateProjectionReference(OrderBinder *this,ParsedExpression *expr,idx_t index)

{
  long lVar1;
  pointer pPVar2;
  BoundConstantExpression *this_00;
  pointer pBVar3;
  ulong in_RCX;
  size_type *this_01;
  string alias;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  Value local_a8;
  Value local_68;
  
  local_c0 = 0;
  local_b8[0] = 0;
  local_c8 = local_b8;
  if ((expr->super_BaseExpression).alias._M_string_length != 0) {
    this_01 = &(expr->super_BaseExpression).alias._M_string_length;
    optional_ptr<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
    ::CheckValid((optional_ptr<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
                  *)this_01);
    if (in_RCX < (ulong)(((long *)*this_01)[1] - *(long *)*this_01 >> 3)) {
      optional_ptr<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
      ::CheckValid((optional_ptr<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
                    *)this_01);
      lVar1 = *(long *)*this_01;
      if ((ulong)(((long *)*this_01)[1] - lVar1 >> 3) <= in_RCX) {
        ::std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)(lVar1 + in_RCX * 8));
      (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_a8,pPVar2);
      ::std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
      if ((undefined1 **)local_a8.type_._0_8_ != (undefined1 **)((long)&local_a8 + 0x10U)) {
        operator_delete((void *)local_a8.type_._0_8_);
      }
      goto LAB_011f8473;
    }
  }
  if (*(long *)(index + 0x18) != 0) {
    ::std::__cxx11::string::_M_assign((string *)&local_c8);
  }
LAB_011f8473:
  Value::UBIGINT(&local_68,in_RCX);
  this_00 = (BoundConstantExpression *)operator_new(0x98);
  Value::Value(&local_a8,&local_68);
  BoundConstantExpression::BoundConstantExpression(this_00,&local_a8);
  local_d0._M_head_impl = this_00;
  Value::~Value(&local_a8);
  Value::~Value(&local_68);
  pBVar3 = unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                         *)&local_d0);
  ::std::__cxx11::string::operator=
            ((string *)&(pBVar3->super_Expression).super_BaseExpression.alias,(string *)&local_c8);
  pBVar3 = unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                         *)&local_d0);
  (pBVar3->super_Expression).super_BaseExpression.query_location.index = *(idx_t *)(index + 0x30);
  (this->binders).
  super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d0._M_head_impl;
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> OrderBinder::CreateProjectionReference(ParsedExpression &expr, const idx_t index) {
	string alias;
	if (extra_list && index < extra_list->size()) {
		alias = extra_list->at(index)->ToString();
	} else {
		if (!expr.GetAlias().empty()) {
			alias = expr.GetAlias();
		}
	}
	auto result = make_uniq<BoundConstantExpression>(Value::UBIGINT(index));
	result->SetAlias(std::move(alias));
	result->SetQueryLocation(expr.GetQueryLocation());
	return std::move(result);
}